

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint64_t helper_float_cvtpw_ps_mips(CPUMIPSState *env,uint64_t fdt0)

{
  float_status *s;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  uVar3 = float32_to_int32_mips((float32)fdt0,s);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  (env->active_fpu).fp_status.float_exception_flags = '\0';
  uVar4 = float32_to_int32_mips((float32)(fdt0 >> 0x20),s);
  bVar2 = (env->active_fpu).fp_status.float_exception_flags;
  (env->active_fpu).fp_status.float_exception_flags = bVar2 | bVar1;
  update_fcr31(env,unaff_retaddr);
  uVar6 = 0x7fffffff00000000;
  if ((bVar2 & 9) == 0) {
    uVar6 = (ulong)uVar4 << 0x20;
  }
  uVar5 = 0x7fffffff;
  if ((bVar1 & 9) == 0) {
    uVar5 = (ulong)uVar3;
  }
  return uVar5 | uVar6;
}

Assistant:

uint64_t helper_float_cvtpw_ps(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;
    uint32_t wth2;
    int excp, excph;

    wt2 = float32_to_int32(fdt0 & 0XFFFFFFFF, &env->active_fpu.fp_status);
    excp = get_float_exception_flags(&env->active_fpu.fp_status);
    if (excp & (float_flag_overflow | float_flag_invalid)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }

    set_float_exception_flags(0, &env->active_fpu.fp_status);
    wth2 = float32_to_int32(fdt0 >> 32, &env->active_fpu.fp_status);
    excph = get_float_exception_flags(&env->active_fpu.fp_status);
    if (excph & (float_flag_overflow | float_flag_invalid)) {
        wth2 = FP_TO_INT32_OVERFLOW;
    }

    set_float_exception_flags(excp | excph, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());

    return ((uint64_t)wth2 << 32) | wt2;
}